

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O1

void __thiscall
AI::HierarchicalTaskNetworkComponent::senseVisual(HierarchicalTaskNetworkComponent *this)

{
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::senseVisual()
{
	/*std::vector<FOverlapResult> results;
	
	Math::Vector3 eyePosition;
	FRotator rotation;
	auto character = Cast<AAICharacter>(AIOwner->GetCharacter());
	rotation = (character->GetMesh()->GetBoneQuaternion(FName("head")) * FQuat(FRotator(0, 90, 0))).Rotator();//.Rotator().Add(90, 0, 0);
	eyePosition = character->GetMesh()->GetBoneLocation(FName("head"));
	
	auto params = FCollisionQueryParams(FName(TEXT("senseVision")), false);
	params.AddIgnoredActor(character);

	auto world = getWorld();

	auto objectParams = FCollisionObjectQueryParams(ECC_TO_BITFIELD(ECC_Pawn));
	auto hit = world->OverlapMultiByObjectType(results, eyePosition, rotation.Quaternion(), objectParams, FCollisionShape::MakeSphere(motionSightRadius), params);//, FCollisionObjectQueryParams(FCollisionObjectQueryParams::AllDynamicObjects));

	auto forward = character->GetActorForwardVector();
	forward = rotation.Vector();

	if (showVisualDebug)
	{
		//detail cone
		DrawDebugCone(world, eyePosition, forward, detailSightRadius / cosf(FMath::DegreesToRadians(detailAngle)), FMath::DegreesToRadians(detailAngle), FMath::DegreesToRadians(detailAngle), 1 / 30.f, FColor::Blue);

		//motion cone
		DrawDebugCone(world, eyePosition, forward, motionSightRadius / cosf(FMath::DegreesToRadians(motionAngle)), FMath::DegreesToRadians(motionAngle), FMath::DegreesToRadians(motionAngle), 1 / 30.f, FColor::Green);
	}

	auto playerWasIdentified = state.current.flags[WorldStateIdentifier::PlayerIdentified]; 
	state.current.flags[WorldStateIdentifier::PlayerIdentified] = false;
		
	if (hit)
	{
		for (auto& result : results)
		{
			Math::Vector3 actorPosition;
			FRotator b;
			result.Actor->GetActorEyesViewPoint(actorPosition, b);
			auto dir = actorPosition - eyePosition;

			float distance = 0.f;
			dir.ToDirectionAndLength(dir, distance);

			auto angle = dot(forward, dir);

			if (angle >= cosf(FMath::DegreesToRadians(motionAngle)))
			{
				auto& alertness = state.current.values[WorldStateIdentifier::Alertness];

				auto player = UGameplayStatics::GetPlayerCharacter(getWorld(), 0);

				auto canIdentify = 
					distance <= (detailSightRadius * alertness / 100.f * 3.f)
					&& (angle >= cosf(FMath::DegreesToRadians(detailAngle)) || playerWasIdentified)
					&& result.Actor == player;
			
				FHitResult traceResult;			
				hit = world->LineTraceSingleByChannel(traceResult, eyePosition, actorPosition, ECollisionChannel::ECC_Pawn, params);			

				if (hit && traceResult.Actor == result.Actor && result.Actor == player)
				{			
					state.current.flags[WorldStateIdentifier::PlayerIdentified] = canIdentify;

					auto vel = traceResult.Actor->GetVelocity();
					vel.normalize();
					state.produceFactVector(ConsumableFact::Player_ForwardVector, vel);

					auto hitLocation = traceResult.Actor->GetActorLocation();
					Stimulus stimulus;
					stimulus.type = StimulusType::Visual;

				
					//TODO: not sure if it should filter based on player or not, chosing not might give some interesting emergent gameplay
					if (traceResult.Actor == player && false)
					{
						stimulus.visual.tag = VisualTag::Player;
					}
					else
					{
						stimulus.visual.tag = VisualTag::Person;
					}
					stimulus.visual.target = result.Actor.Get();
					stimulus.visual.x = hitLocation.x;
					stimulus.visual.y = hitLocation.y;
					stimulus.visual.intensity = angle * FMath::Max(detailSightRadius - distance, 0.f) / detailSightRadius * 100.f;
				
					state.memory.sensoryMemory.push_back(stimulus);

					encodeEngramIfUnique(stimulus, state.memory.shortTermMemory);

					if (canIdentify || alertness > 80.f)
					{
						alertness = 100.f;

					}
					else
					{
						alertness += 0.8f;

						if (alertness > 100.f)
							alertness = 100.f;
					}
				}
			}		
		}
	}*/
}